

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1285::run(TestCase1285 *this)

{
  ulong uVar1;
  uint i;
  long lVar2;
  ListElementCount local_1ac;
  DebugComparison<int,_unsigned_int> _kjCondition;
  PointerBuilder local_188;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_188,&message.super_MessageBuilder);
  _kjCondition.op.content.size_ = (size_t)local_188.pointer;
  _kjCondition._0_8_ = local_188.segment;
  _kjCondition.op.content.ptr = (char *)local_188.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&reader,(PointerBuilder *)&_kjCondition,(StructSize)0x140006);
  local_188.pointer =
       (WirePointer *)(CONCAT44(reader.reader.step,reader.reader.elementCount) + 0x58);
  local_188.segment = (SegmentBuilder *)reader.reader.segment;
  local_188.capTable = (CapTableBuilder *)reader.reader.capTable;
  PointerBuilder::disown((OrphanBuilder *)&_kjCondition,&local_188);
  orphan.builder.capTable = (CapTableBuilder *)_kjCondition.op.content.size_;
  orphan.builder.tag.content._0_4_ = _kjCondition.left;
  orphan.builder.tag.content._4_4_ = _kjCondition.right;
  orphan.builder.segment = (SegmentBuilder *)_kjCondition.op.content.ptr;
  OrphanBuilder::truncate(&orphan.builder,(char *)0x3,4);
  OrphanBuilder::asListReader(&reader.reader,&orphan.builder,FOUR_BYTES);
  _kjCondition.right = reader.reader.elementCount;
  _kjCondition.left = 3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.reader.elementCount == 3;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_188.segment = (SegmentBuilder *)CONCAT44(local_188.segment._4_4_,3);
    local_1ac = reader.reader.elementCount;
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x50c,ERROR,
               "\"failed: expected \" \"(3) == (reader.size())\", _kjCondition, 3, reader.size()",
               (char (*) [40])"failed: expected (3) == (reader.size())",&_kjCondition,
               (int *)&local_188,&local_1ac);
  }
  lVar2 = 0;
  do {
    uVar1 = (ulong)reader.reader.step * lVar2 >> 3;
    _kjCondition._0_8_ = (ulong)*(uint *)(reader.reader.ptr + uVar1) << 0x20;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = *(uint *)(reader.reader.ptr + uVar1) == 0;
    if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
      local_188.segment = (SegmentBuilder *)((ulong)local_188.segment & 0xffffffff00000000);
      local_1ac = *(ListElementCount *)(reader.reader.ptr + uVar1);
      kj::_::Debug::
      log<char_const(&)[36],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x50f,ERROR,
                 "\"failed: expected \" \"(0) == (reader[i])\", _kjCondition, 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",&_kjCondition,
                 (int *)&local_188,&local_1ac);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListFromEmpty) {
  MallocMessageBuilder message;

  auto orphan = message.initRoot<TestAllTypes>().disownUInt32List();
  orphan.truncate(3);

  auto reader = orphan.getReader();
  EXPECT_EQ(3, reader.size());

  for (uint i = 0; i < 3; i++) {
    EXPECT_EQ(0, reader[i]);
  }
}